

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall
CTcParser::add_gen_obj_prop(CTcParser *this,CTcSymObj *obj,char *propn,CTcConstVal *val)

{
  CTcPrsSymtab *this_00;
  size_t len;
  CTcSymProp *prop;
  
  this_00 = G_prs->global_symtab_;
  len = strlen(propn);
  prop = (CTcSymProp *)
         CTcPrsSymtab::find_or_def(this_00,propn,len,0,TCPRS_UNDEF_ADD_PROP_NO_WARNING);
  if ((prop != (CTcSymProp *)0x0) &&
     (*(int *)&(prop->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS
               .super_CVmHashEntry.field_0x24 == 3)) {
    if (G_vmifc != (CTcVMIfc *)0x0) {
      (*G_vmifc->_vptr_CTcVMIfc[4])
                (G_vmifc,(ulong)(uint)(obj->super_CTcSymObjBase).obj_id_,
                 (ulong)(prop->super_CTcSymPropBase).prop_,val);
      return;
    }
    add_gen_obj_prop_stat(this,obj,prop,val);
    return;
  }
  return;
}

Assistant:

void CTcParser::add_gen_obj_prop(
    CTcSymObj *obj, const char *propn, const CTcConstVal *val)
{
    /* look up the property - this counts as an explicit definition */
    CTcSymbol *sym = G_prs->get_global_symtab()
                     ->find_or_def_prop_explicit(propn, strlen(propn), FALSE);

    /* make sure we found it, and that it's a property symbol */
    if (sym != 0 && sym->get_type() == TC_SYM_PROP)
    {
        /* it's a property symbol - cast it */
        CTcSymProp *prop = (CTcSymProp *)sym;

        /* check for dynamic compilation */
        if (G_vmifc != 0)
        {
            /* dynamic mode - add it to the live object in the VM */
            G_vmifc->set_prop(obj->get_obj_id(), prop->get_prop(), val);
        }
        else
        {            
            /* static compilation - add the value to the object statement */
            add_gen_obj_prop_stat(obj, prop, val);
        }
    }
}